

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pong.cpp
# Opt level: O2

Am_Wrapper * score_as_string_proc(Am_Object *self)

{
  int iVar1;
  Am_Value *this;
  ostream *poVar2;
  Am_Wrapper *pAVar3;
  Am_String str;
  char line [100];
  ostrstream oss;
  
  this = (Am_Value *)Am_Object::Get((ushort)self,(ulong)SCORE);
  iVar1 = Am_Value::operator_cast_to_int(this);
  std::ostrstream::ostrstream(&oss,line,100,_S_out);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&oss,iVar1);
  std::ends<char,std::char_traits<char>>(poVar2);
  Am_String::Am_String(&str,line,true);
  pAVar3 = Am_String::operator_cast_to_Am_Wrapper_(&str);
  Am_String::~Am_String(&str);
  std::ostrstream::~ostrstream(&oss);
  return pAVar3;
}

Assistant:

Am_Define_String_Formula(score_as_string)
{
  int score = self.Get(SCORE);
  char line[100];
  OSTRSTREAM_CONSTR(oss, line, 100, ios::out);
  oss << score << ends;
  OSTRSTREAM_COPY(oss, line, 100);
  Am_String str = line;
  return str;
}